

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_type.cpp
# Opt level: O0

string * duckdb::CatalogTypeToString_abi_cxx11_(CatalogType type)

{
  undefined1 in_SIL;
  string *in_RDI;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [19];
  allocator local_a [10];
  
  switch(in_SIL) {
  case 0:
  case 0x33:
  case 0x34:
  case 100:
  default:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"INVALID",&local_2f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Table",&local_1e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 2:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Schema",&local_1f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 3:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"View",&local_28);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 4:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Index",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 5:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Prepared Statement",&local_2a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 6:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Sequence",&local_2b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 7:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Collation",local_a);
    ::std::allocator<char>::~allocator((allocator<char> *)local_a);
    break;
  case 8:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Type",local_1d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 9:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Database",&local_20);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 0x19:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Table Function",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 0x1a:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Scalar Function",&local_22);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 0x1b:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Aggregate Function",&local_23);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  case 0x1c:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Pragma Function",&local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  case 0x1d:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Copy Function",&local_24);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_24);
    break;
  case 0x1e:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Macro Function",&local_26);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0x1f:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Table Macro Function",&local_27);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 0x47:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Secret",&local_2c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 0x48:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Secret Type",&local_2d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 0x49:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"Secret Function",&local_2e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  return in_RDI;
}

Assistant:

string CatalogTypeToString(CatalogType type) {
	switch (type) {
	case CatalogType::COLLATION_ENTRY:
		return "Collation";
	case CatalogType::TYPE_ENTRY:
		return "Type";
	case CatalogType::TABLE_ENTRY:
		return "Table";
	case CatalogType::SCHEMA_ENTRY:
		return "Schema";
	case CatalogType::DATABASE_ENTRY:
		return "Database";
	case CatalogType::TABLE_FUNCTION_ENTRY:
		return "Table Function";
	case CatalogType::SCALAR_FUNCTION_ENTRY:
		return "Scalar Function";
	case CatalogType::AGGREGATE_FUNCTION_ENTRY:
		return "Aggregate Function";
	case CatalogType::COPY_FUNCTION_ENTRY:
		return "Copy Function";
	case CatalogType::PRAGMA_FUNCTION_ENTRY:
		return "Pragma Function";
	case CatalogType::MACRO_ENTRY:
		return "Macro Function";
	case CatalogType::TABLE_MACRO_ENTRY:
		return "Table Macro Function";
	case CatalogType::VIEW_ENTRY:
		return "View";
	case CatalogType::INDEX_ENTRY:
		return "Index";
	case CatalogType::PREPARED_STATEMENT:
		return "Prepared Statement";
	case CatalogType::SEQUENCE_ENTRY:
		return "Sequence";
	case CatalogType::SECRET_ENTRY:
		return "Secret";
	case CatalogType::SECRET_TYPE_ENTRY:
		return "Secret Type";
	case CatalogType::SECRET_FUNCTION_ENTRY:
		return "Secret Function";
	case CatalogType::INVALID:
	case CatalogType::DELETED_ENTRY:
	case CatalogType::RENAMED_ENTRY:
	case CatalogType::DEPENDENCY_ENTRY:
		break;
	}
	return "INVALID";
}